

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O2

void __thiscall despot::Adventurer::Adventurer(Adventurer *this,int num_goals)

{
  ostream *poVar1;
  allocator<char> local_294;
  allocator<char> local_293;
  allocator<char> local_292;
  allocator<char> local_291 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string map;
  istringstream iss;
  
  despot::BeliefMDP::BeliefMDP(&this->super_BeliefMDP);
  *(undefined8 *)&this->field_0x30 = 0;
  *(undefined8 *)&this->field_0x38 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined ***)this = &PTR__Adventurer_001159d0;
  *(undefined ***)&this->super_MDP = &PTR__Adventurer_00115b08;
  *(undefined ***)&this->super_StateIndexer = &PTR__Adventurer_00115b58;
  *(undefined ***)&this->super_StatePolicy = &PTR__Adventurer_00115b90;
  (this->trap_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->trap_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->trap_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->goal_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->goal_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->goal_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->goal_reward_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->goal_reward_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->goal_reward_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->states_).
  super__Vector_base<despot::AdventurerState_*,_std::allocator<despot::AdventurerState_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->states_).
  super__Vector_base<despot::AdventurerState_*,_std::allocator<despot::AdventurerState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->states_).
  super__Vector_base<despot::AdventurerState_*,_std::allocator<despot::AdventurerState_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::AdventurerState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::AdventurerState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::AdventurerState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::AdventurerState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory_pool_).num_allocated_ = 0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::AdventurerState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::AdventurerState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::AdventurerState_*,_std::allocator<despot::AdventurerState_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::AdventurerState_*,_std::allocator<despot::AdventurerState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::AdventurerState_*,_std::allocator<despot::AdventurerState_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  current_ = this;
  if ((num_goals != 2) && (num_goals != 0x32)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "[Adventurer::Adventurer] Only 2 or 50 goals are supported.");
    std::endl<char,std::char_traits<char>>(poVar1);
    exit(0);
  }
  if (num_goals == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"mapSize = 5 nGoal = 2\n",local_291);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"0.5 0.5 0.5 0.5 0.5\n",&local_292);
    std::operator+(&local_1f0,&local_210,&local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"0.5 101 0.5 150\n",&local_293);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iss,
                   &local_1f0,&local_250);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"0.3",&local_294);
    std::operator+(&map,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iss,
                   &local_270);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"mapSize = 5 nGoal = 50\n",local_291);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"0.5 0.5 0.5 0.5 0.5\n",&local_292);
    std::operator+(&local_1f0,&local_210,&local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,
               "0.02 101 0.02 102 0.02 103 0.02 104 0.02 105 0.02 106 0.02 107 0.02 108 0.02 109 0.02 110 0.02 111 0.02 112 0.02 113 0.02 114 0.02 115 0.02 116 0.02 117 0.02 118 0.02 119 0.02 120 0.02 121 0.02 122 0.02 123 0.02 124 0.02 125 0.02 126 0.02 127 0.02 128 0.02 129 0.02 130 0.02 131 0.02 132 0.02 133 0.02 134 0.02 135 0.02 136 0.02 137 0.02 138 0.02 139 0.02 140 0.02 141 0.02 142 0.02 143 0.02 144 0.02 145 0.02 146 0.02 147 0.02 148 0.02 149 0.02 150\n"
               ,&local_293);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iss,
                   &local_1f0,&local_250);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"0.3",&local_294);
    std::operator+(&map,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iss,
                   &local_270);
  }
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&iss);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&map,_S_in);
  Init(this,(istream *)&iss);
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  std::__cxx11::string::~string((string *)&map);
  return;
}

Assistant:

Adventurer::Adventurer(int num_goals) {
	current_ = this;

	if (num_goals != 2 && num_goals != 50) {
		cerr << "[Adventurer::Adventurer] Only 2 or 50 goals are supported." << endl;
		exit(0);
	}

	string map =
		num_goals == 2 ?
		(string("mapSize = 5 nGoal = 2\n")
			+ string("0.5 0.5 0.5 0.5 0.5\n") // probabilities of being trapped
			+ string("0.5 101 0.5 150\n") // goal probability, goal reward
			+ string("0.3") // observation noise
		)
		:
		(string("mapSize = 5 nGoal = 50\n")
			+ string("0.5 0.5 0.5 0.5 0.5\n") // probabilities of being trapped
			+ string("0.02 101 0.02 102 0.02 103 0.02 104 0.02 105 0.02 106 0.02 107 0.02 108 0.02 109 0.02 110 0.02 111 0.02 112 0.02 113 0.02 114 0.02 115 0.02 116 0.02 117 0.02 118 0.02 119 0.02 120 0.02 121 0.02 122 0.02 123 0.02 124 0.02 125 0.02 126 0.02 127 0.02 128 0.02 129 0.02 130 0.02 131 0.02 132 0.02 133 0.02 134 0.02 135 0.02 136 0.02 137 0.02 138 0.02 139 0.02 140 0.02 141 0.02 142 0.02 143 0.02 144 0.02 145 0.02 146 0.02 147 0.02 148 0.02 149 0.02 150\n")  // goal probability, goal reward
			+ string("0.3") // observation noise
		);

	istringstream iss(map);
	Init(iss);
	// PrintPOMDPX();
}